

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::TPZFYsmpMatrix
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t rows,int64_t cols)

{
  TPZPardisoSolver<std::complex<float>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFYsmpMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (in_stack_ffffffffffffffc0,(void **)in_RDI,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__TPZFYsmpMatrix_02436eb0;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x20));
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x40));
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x60));
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x80));
  TPZPardisoSolver<std::complex<float>_>::TPZPardisoSolver(in_RSI);
  *(undefined4 *)(in_RDI + 0xa0) = 0;
  return;
}

Assistant:

TPZFYsmpMatrix<TVar>::TPZFYsmpMatrix(const int64_t rows,const int64_t cols ) :
TPZRegisterClassId(&TPZFYsmpMatrix::ClassId),TPZMatrix<TVar>(rows,cols) {
	// Constructs an empty TPZFYsmpMatrix
	//    fSolver = -1;
	fSymmetric = 0;
	//    fMaxIterations = 4;
	//    fSORRelaxation = 1.;
#ifdef CONSTRUCTOR
	cerr << "TPZFYsmpMatrix(int rows,int cols)\n";
#endif
}